

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkPointFrame::IntLoadResidual_CqL
          (ChLinkPointFrame *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c)

{
  int iVar1;
  
  iVar1 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 == '\0') {
    return;
  }
  if ((long)(ulong)off_L <
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    ChConstraintTwoGeneric::MultiplyTandAdd
              (&this->constraint1,R,
               c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[off_L]);
    if ((long)(ulong)(off_L + 1) <
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      ChConstraintTwoGeneric::MultiplyTandAdd
                (&this->constraint2,R,
                 c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data[off_L + 1]);
      if ((long)(ulong)(off_L + 2) <
          (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
        ChConstraintTwoGeneric::MultiplyTandAdd
                  (&this->constraint3,R,
                   c * (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data[off_L + 2]);
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkPointFrame::IntLoadResidual_CqL(const unsigned int off_L,    // offset in L multipliers
                                           ChVectorDynamic<>& R,        // result: the R residual, R += c*Cq'*L
                                           const ChVectorDynamic<>& L,  // the L vector
                                           const double c               // a scaling factor
) {
    if (!IsActive())
        return;

    constraint1.MultiplyTandAdd(R, L(off_L + 0) * c);
    constraint2.MultiplyTandAdd(R, L(off_L + 1) * c);
    constraint3.MultiplyTandAdd(R, L(off_L + 2) * c);
}